

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialize.cpp
# Opt level: O1

Class * __thiscall chatra::Reader::readClass(Reader *this)

{
  pointer ppCVar1;
  int iVar2;
  mapped_type *ppCVar3;
  unsigned_long uVar4;
  mapped_type pCVar5;
  undefined8 *puVar6;
  Node *local_20;
  
  iVar2 = readRawInteger<int>(this);
  if (iVar2 == 0) {
    pCVar5 = (Class *)0x0;
  }
  else if (iVar2 == 2) {
    uVar4 = readRawInteger<unsigned_long>(this);
    ppCVar1 = (this->classMap).
              super__Vector_base<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->classMap).
                      super__Vector_base<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1 >> 3) <= uVar4) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4);
    }
    pCVar5 = ppCVar1[uVar4];
  }
  else {
    if (iVar2 != 1) {
      puVar6 = (undefined8 *)__cxa_allocate_exception(0x28);
      *puVar6 = 0;
      puVar6[1] = 0;
      puVar6[2] = 0;
      puVar6[3] = 0;
      puVar6[4] = 0;
      puVar6[1] = puVar6 + 3;
      puVar6[2] = 0;
      *(undefined1 *)(puVar6 + 3) = 0;
      *puVar6 = &PTR__NativeException_00245b18;
      __cxa_throw(puVar6,&IllegalArgumentException::typeinfo,NativeException::~NativeException);
    }
    local_20 = readNode(this);
    ppCVar3 = std::__detail::
              _Map_base<chatra::Node_*,_std::pair<chatra::Node_*const,_const_chatra::Class_*>,_std::allocator<std::pair<chatra::Node_*const,_const_chatra::Class_*>_>,_std::__detail::_Select1st,_std::equal_to<chatra::Node_*>,_std::hash<chatra::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::at((_Map_base<chatra::Node_*,_std::pair<chatra::Node_*const,_const_chatra::Class_*>,_std::allocator<std::pair<chatra::Node_*const,_const_chatra::Class_*>_>,_std::__detail::_Select1st,_std::equal_to<chatra::Node_*>,_std::hash<chatra::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)&this->nodeClassMap,&local_20);
    pCVar5 = *ppCVar3;
  }
  return pCVar5;
}

Assistant:

const Class* Reader::readClass() {
	chatra_assert(entityMapEnabled);
	CHATRA_RESTORE_TYPE_TAG(Class);

	switch (read<int>()) {
	case 0:  return nullptr;
	case 1:  return nodeClassMap.at(read<Node*>());
	case 2:  return classMap.at(read<size_t>());
	default:
		throw IllegalArgumentException();
	}
}